

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O0

int fio_base64_decode(char *target,char *encoded,int base64_len)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  int iVar5;
  char *pcVar6;
  ushort **ppuVar7;
  int *piVar8;
  byte *pbVar9;
  bool bVar10;
  int local_28;
  uint8_t tmp4;
  uint8_t tmp3;
  uint8_t tmp2;
  uint8_t tmp1;
  int written;
  int base64_len_local;
  char *encoded_local;
  char *target_local;
  
  encoded_local = target;
  if (target == (char *)0x0) {
    encoded_local = encoded;
  }
  if (base64_len < 1) {
    *encoded_local = '\0';
    target_local._4_4_ = 0;
  }
  else {
    local_28 = 0;
    _tmp4 = base64_len;
    while( true ) {
      bVar10 = false;
      if (_tmp4 != 0) {
        bVar10 = base64_decodes[(byte)encoded[_tmp4 + -1]] == 0;
      }
      _written = (byte *)encoded;
      if (!bVar10) break;
      _tmp4 = _tmp4 + -1;
    }
    while( true ) {
      bVar10 = false;
      if (_tmp4 != 0) {
        ppuVar7 = __ctype_b_loc();
        bVar10 = ((*ppuVar7)[(int)(uint)*_written] & 0x2000) != 0;
      }
      if (!bVar10) break;
      _tmp4 = _tmp4 + -1;
      _written = _written + 1;
    }
    while (3 < _tmp4) {
      if (_tmp4 == 0) {
        return local_28;
      }
      bVar1 = *_written;
      bVar2 = _written[1];
      pbVar9 = _written + 3;
      bVar3 = _written[2];
      _written = _written + 4;
      bVar4 = *pbVar9;
      if ((((base64_decodes[bVar1] == 0) || (base64_decodes[bVar2] == 0)) ||
          (base64_decodes[bVar3] == 0)) || (base64_decodes[bVar4] == 0)) {
        piVar8 = __errno_location();
        *piVar8 = 0x22;
        goto LAB_0015ccbb;
      }
      *encoded_local =
           (byte)((base64_decodes[bVar1] & 0x3f) << 2) | (byte)((base64_decodes[bVar2] & 0x3f) >> 4)
      ;
      pbVar9 = (byte *)(encoded_local + 2);
      encoded_local[1] =
           (byte)((base64_decodes[bVar2] & 0x3f) << 4) | (byte)((base64_decodes[bVar3] & 0x3f) >> 2)
      ;
      encoded_local = encoded_local + 3;
      *pbVar9 = (byte)((base64_decodes[bVar3] & 0x3f) << 6) | (byte)base64_decodes[bVar4] & 0x3f;
      _tmp4 = _tmp4 + -4;
      local_28 = local_28 + 3;
      while( true ) {
        bVar10 = false;
        if (_tmp4 != 0) {
          ppuVar7 = __ctype_b_loc();
          bVar10 = ((*ppuVar7)[(int)(char)*_written] & 0x2000) != 0;
        }
        if (!bVar10) break;
        _tmp4 = _tmp4 + -1;
        _written = _written + 1;
      }
    }
    if (_tmp4 == 1) {
      if (base64_decodes[*_written] == 0) {
        piVar8 = __errno_location();
        *piVar8 = 0x22;
        _written = _written + 1;
      }
      else {
        *encoded_local = (byte)base64_decodes[*_written] & 0x3f;
        local_28 = local_28 + 1;
        _written = _written + 1;
        encoded_local = encoded_local + 1;
      }
    }
    else if (_tmp4 == 2) {
      bVar1 = _written[1];
      if ((base64_decodes[*_written] == 0) || (base64_decodes[bVar1] == 0)) {
        piVar8 = __errno_location();
        *piVar8 = 0x22;
        _written = _written + 2;
      }
      else {
        *encoded_local = (char)((base64_decodes[*_written] & 0x3f) << 2);
        encoded_local[1] = (char)((base64_decodes[bVar1] & 0x3f) << 4);
        local_28 = local_28 + 2;
        _written = _written + 2;
        encoded_local = encoded_local + 2;
      }
    }
    else if (_tmp4 == 3) {
      bVar1 = _written[1];
      bVar2 = _written[2];
      if (((base64_decodes[*_written] == 0) || (base64_decodes[bVar1] == 0)) ||
         (base64_decodes[bVar2] == 0)) {
        piVar8 = __errno_location();
        *piVar8 = 0x22;
        _written = _written + 3;
      }
      else {
        *encoded_local = (char)((base64_decodes[*_written] & 0x3f) << 2);
        encoded_local[1] =
             (byte)((base64_decodes[bVar1] & 0x3f) << 4) |
             (byte)((base64_decodes[bVar2] & 0x3f) >> 2);
        encoded_local[2] = (char)((base64_decodes[bVar2] & 0x3f) << 6);
        local_28 = local_28 + 3;
        _written = _written + 3;
        encoded_local = encoded_local + 3;
      }
    }
LAB_0015ccbb:
    if (_written[-1] == 0x3d) {
      iVar5 = local_28 + -1;
      pcVar6 = encoded_local + -1;
      if (_written[-2] == 0x3d) {
        iVar5 = local_28 + -2;
        pcVar6 = encoded_local + -2;
      }
      encoded_local = pcVar6;
      local_28 = iVar5;
      if (local_28 < 0) {
        local_28 = 0;
      }
    }
    *encoded_local = '\0';
    target_local._4_4_ = local_28;
  }
  return target_local._4_4_;
}

Assistant:

int fio_base64_decode(char *target, char *encoded, int base64_len) {
  if (!target)
    target = encoded;
  if (base64_len <= 0) {
    target[0] = 0;
    return 0;
  }
  int written = 0;
  uint8_t tmp1, tmp2, tmp3, tmp4;
  // skip unknown data at end
  while (base64_len &&
         !base64_decodes[*(uint8_t *)(encoded + (base64_len - 1))]) {
    base64_len--;
  }
  // skip white space
  while (base64_len && isspace((*(uint8_t *)encoded))) {
    base64_len--;
    encoded++;
  }
  while (base64_len >= 4) {
    if (!base64_len) {
      return written;
    }
    tmp1 = *(uint8_t *)(encoded++);
    tmp2 = *(uint8_t *)(encoded++);
    tmp3 = *(uint8_t *)(encoded++);
    tmp4 = *(uint8_t *)(encoded++);
    if (!base64_decodes[tmp1] || !base64_decodes[tmp2] ||
        !base64_decodes[tmp3] || !base64_decodes[tmp4]) {
      errno = ERANGE;
      goto finish;
    }
    *(target++) = (BITVAL(tmp1) << 2) | (BITVAL(tmp2) >> 4);
    *(target++) = (BITVAL(tmp2) << 4) | (BITVAL(tmp3) >> 2);
    *(target++) = (BITVAL(tmp3) << 6) | (BITVAL(tmp4));
    // make sure we don't loop forever.
    base64_len -= 4;
    // count written bytes
    written += 3;
    // skip white space
    while (base64_len && isspace((*encoded))) {
      base64_len--;
      encoded++;
    }
  }
  // deal with the "tail" of the mis-encoded stream - this shouldn't happen
  tmp1 = 0;
  tmp2 = 0;
  tmp3 = 0;
  tmp4 = 0;
  switch (base64_len) {
  case 1:
    tmp1 = *(uint8_t *)(encoded++);
    if (!base64_decodes[tmp1]) {
      errno = ERANGE;
      goto finish;
    }
    *(target++) = BITVAL(tmp1);
    written += 1;
    break;
  case 2:
    tmp1 = *(uint8_t *)(encoded++);
    tmp2 = *(uint8_t *)(encoded++);
    if (!base64_decodes[tmp1] || !base64_decodes[tmp2]) {
      errno = ERANGE;
      goto finish;
    }
    *(target++) = (BITVAL(tmp1) << 2) | (BITVAL(tmp2) >> 6);
    *(target++) = (BITVAL(tmp2) << 4);
    written += 2;
    break;
  case 3:
    tmp1 = *(uint8_t *)(encoded++);
    tmp2 = *(uint8_t *)(encoded++);
    tmp3 = *(uint8_t *)(encoded++);
    if (!base64_decodes[tmp1] || !base64_decodes[tmp2] ||
        !base64_decodes[tmp3]) {
      errno = ERANGE;
      goto finish;
    }
    *(target++) = (BITVAL(tmp1) << 2) | (BITVAL(tmp2) >> 6);
    *(target++) = (BITVAL(tmp2) << 4) | (BITVAL(tmp3) >> 2);
    *(target++) = BITVAL(tmp3) << 6;
    written += 3;
    break;
  }
finish:
  if (encoded[-1] == '=') {
    target--;
    written--;
    if (encoded[-2] == '=') {
      target--;
      written--;
    }
    if (written < 0)
      written = 0;
  }
  *target = 0;
  return written;
}